

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::Broker> helics::BrokerFactory::findBroker(string_view brokerName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulonglong index;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  BrokerFactory *this;
  shared_ptr<helics::Broker> sVar3;
  shared_ptr<helics::Broker> brk;
  char *ept;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40 [2];
  long local_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this = (BrokerFactory *)brokerName._M_len;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40);
  sVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
                    ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)&local_50,
                     (string *)searchableBrokers);
  _Var2 = sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    _Var2._M_pi = extraout_RDX;
  }
  p_Var1 = local_48;
  if (local_50 == 0) {
    if (brokerName._M_str == (char *)0x0) {
      sVar3 = getConnectedBroker();
      _Var2 = sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
    }
    else {
      if (*in_RDX == '#') {
        local_40[0] = (long *)0x0;
        index = strtoull(in_RDX + 1,(char **)local_40,10);
        _Var2._M_pi = extraout_RDX_00;
        if (in_RDX + 1 < local_40[0]) {
          sVar3 = getBrokerByIndex(this,index);
          _Var2 = sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          goto LAB_0028ce5d;
        }
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
  }
  else {
    *(long *)this = local_50;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    local_50 = 0;
  }
LAB_0028ce5d:
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> findBroker(std::string_view brokerName)
{
    auto brk = searchableBrokers.findObject(std::string(brokerName));
    if (brk) {
        return brk;
    }
    if (brokerName.empty()) {
        return getConnectedBroker();
    }
    if (brokerName.front() == '#') {
        char* ept = nullptr;
        auto val = std::strtoull(brokerName.data() + 1, &ept, 10);
        return (ept > brokerName.data() + 1) ? getBrokerByIndex(val) : nullptr;
    }
    return nullptr;
}